

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapyRateTest.cpp
# Opt level: O3

void runRateTestStreamLoop
               (Device *device,Stream *stream,int direction,size_t numChans,size_t elemSize)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *__s;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int flags;
  longlong timeNs;
  vector<void_*,_std::allocator<void_*>_> buffs;
  size_t chanMask;
  int flags_1;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  buffMem;
  longlong timeNs_1;
  undefined4 local_dc;
  long local_d8;
  undefined8 local_d0;
  uint local_c4;
  vector<char,_std::allocator<char>_> local_c0;
  ulong local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  allocator_type local_80 [12];
  undefined1 local_74 [4];
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_70;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  undefined1 local_38 [8];
  
  local_a0 = (**(code **)(*(long *)device + 0x78))();
  std::vector<char,_std::allocator<char>_>::vector
            (&local_c0,local_a0 * elemSize,(allocator_type *)&local_d0);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&local_70,numChans,&local_c0,local_80);
  if (local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&local_c0,numChans,
             (allocator_type *)&local_d0);
  if (numChans != 0) {
    lVar4 = 0;
    sVar7 = 0;
    do {
      *(undefined8 *)
       (local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + sVar7 * 8) =
           *(undefined8 *)
            ((long)&((local_70.
                      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
                    ._M_start + lVar4);
      sVar7 = sVar7 + 1;
      lVar4 = lVar4 + 0x18;
    } while (numChans != sVar7);
  }
  local_88 = std::chrono::_V2::system_clock::now();
  lVar4 = std::chrono::_V2::system_clock::now();
  local_90 = std::chrono::_V2::system_clock::now();
  local_98 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Starting stream loop, press Ctrl+C to exit...",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  (**(code **)(*(long *)device + 0x80))(device,stream,0,0,0);
  signal(2,sigIntHandler);
  if (loopDone == '\0') {
    auVar12._8_4_ = (int)(numChans >> 0x20);
    auVar12._0_8_ = numChans;
    auVar12._12_4_ = 0x45300000;
    dStack_40 = auVar12._8_8_ - 1.9342813113834067e+25;
    local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)numChans) - 4503599627370496.0);
    auVar13._8_4_ = (int)(elemSize >> 0x20);
    auVar13._0_8_ = elemSize;
    auVar13._12_4_ = 0x45300000;
    dStack_50 = auVar13._8_8_ - 1.9342813113834067e+25;
    local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)elemSize) - 4503599627370496.0);
    local_a8 = 0;
    lVar8 = 0;
    uVar10 = 0;
    uVar9 = 0;
    do {
      local_dc = 0;
      local_d0 = 0;
      local_d8 = lVar8;
      if (direction == 0) {
        uVar1 = (**(code **)(*(long *)device + 0x98))
                          (device,stream,
                           local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,local_a0,&local_dc,0,100000);
LAB_0010b9f4:
        lVar8 = local_d8;
        if (uVar1 == 0xfffffff9) {
          uVar10 = uVar10 + 1;
        }
        else if (uVar1 != 0xffffffff) {
          if (uVar1 != 0xfffffffc) {
            if (-1 < (int)uVar1) goto LAB_0010ba26;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unexpected stream error ",0x18);
            __s = (char *)SoapySDR::errToStr(uVar1);
            if (__s == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x112308);
            }
            else {
              sVar6 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar6);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
            std::ostream::put('\b');
            std::ostream::flush();
            break;
          }
          uVar9 = uVar9 + 1;
        }
      }
      else {
        uVar1 = 0;
        if (direction == 1) {
          uVar1 = (**(code **)(*(long *)device + 0x90))
                            (device,stream,
                             local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,local_a0,&local_dc,&local_d0,100000);
          goto LAB_0010b9f4;
        }
LAB_0010ba26:
        local_c4 = uVar1;
        lVar5 = std::chrono::_V2::system_clock::now();
        if (local_90 + 300000000 < lVar5) {
          uVar1 = (uint)local_a8;
          uVar2 = uVar1 + 3;
          if (-1 < (int)uVar1) {
            uVar2 = uVar1;
          }
          printf("\b%c",(ulong)(uint)(int)"|/-\\"[(int)(uVar1 - (uVar2 & 0xfffffffc))]);
          fflush(_stdout);
          local_a8 = (ulong)(uVar1 + 1);
          local_90 = lVar5;
        }
        lVar8 = local_98;
        if (local_98 + 1000000000 < lVar5) {
          while( true ) {
            do {
              while (iVar3 = (**(code **)(*(long *)device + 0xa0))
                                       (device,stream,local_80,local_74,local_38), iVar3 == -7) {
                uVar10 = uVar10 + 1;
              }
            } while (iVar3 == -6);
            lVar8 = lVar5;
            if (iVar3 != -4) break;
            uVar9 = uVar9 + 1;
          }
        }
        local_98 = lVar8;
        lVar8 = local_d8 + (ulong)local_c4;
        if (lVar4 + 5000000000 < lVar5) {
          auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar14._0_8_ = lVar8;
          auVar14._12_4_ = 0x45300000;
          dVar11 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                   (double)((lVar5 - local_88) / 1000);
          printf("\b%g Msps\t%g MBps",dVar11,dVar11 * local_48 * local_58);
          if (uVar9 != 0) {
            printf("\tOverflows %u",(ulong)uVar9);
          }
          if (uVar10 != 0) {
            printf("\tUnderflows %u",(ulong)uVar10);
          }
          printf("\n ");
          lVar4 = lVar5;
        }
      }
    } while (loopDone == '\0');
  }
  (**(code **)(*(long *)device + 0x88))(device,stream,0,0);
  if (local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  return;
}

Assistant:

void runRateTestStreamLoop(
    SoapySDR::Device *device,
    SoapySDR::Stream *stream,
    const int direction,
    const size_t numChans,
    const size_t elemSize)
{
    //allocate buffers for the stream read/write
    const size_t numElems = device->getStreamMTU(stream);
    std::vector<std::vector<char>> buffMem(numChans, std::vector<char>(elemSize*numElems));
    std::vector<void *> buffs(numChans);
    for (size_t i = 0; i < numChans; i++) buffs[i] = buffMem[i].data();

    //state collected in this loop
    unsigned int overflows(0);
    unsigned int underflows(0);
    unsigned long long totalSamples(0);
    const auto startTime = std::chrono::high_resolution_clock::now();
    auto timeLastPrint = std::chrono::high_resolution_clock::now();
    auto timeLastSpin = std::chrono::high_resolution_clock::now();
    auto timeLastStatus = std::chrono::high_resolution_clock::now();
    int spinIndex(0);

    std::cout << "Starting stream loop, press Ctrl+C to exit..." << std::endl;
    device->activateStream(stream);
    signal(SIGINT, sigIntHandler);
    while (not loopDone)
    {
        int ret(0);
        int flags(0);
        long long timeNs(0);
        switch(direction)
        {
        case SOAPY_SDR_RX:
            ret = device->readStream(stream, buffs.data(), numElems, flags, timeNs);
            break;
        case SOAPY_SDR_TX:
            ret = device->writeStream(stream, buffs.data(), numElems, flags, timeNs);
            break;
        }

        if (ret == SOAPY_SDR_TIMEOUT) continue;
        if (ret == SOAPY_SDR_OVERFLOW)
        {
            overflows++;
            continue;
        }
        if (ret == SOAPY_SDR_UNDERFLOW)
        {
            underflows++;
            continue;
        }
        if (ret < 0)
        {
            std::cerr << "Unexpected stream error " << SoapySDR::errToStr(ret) << std::endl;
            break;
        }
        totalSamples += ret;

        const auto now = std::chrono::high_resolution_clock::now();
        if (timeLastSpin + std::chrono::milliseconds(300) < now)
        {
            timeLastSpin = now;
            static const char spin[] = {"|/-\\"};
            printf("\b%c", spin[(spinIndex++)%4]);
            fflush(stdout);
        }
        //occasionally read out the stream status (non blocking)
        if (timeLastStatus + std::chrono::seconds(1) < now)
        {
            timeLastStatus = now;
            while (true)
            {
                size_t chanMask; int flags; long long timeNs;
                ret = device->readStreamStatus(stream, chanMask, flags, timeNs, 0);
                if (ret == SOAPY_SDR_OVERFLOW) overflows++;
                else if (ret == SOAPY_SDR_UNDERFLOW) underflows++;
                else if (ret == SOAPY_SDR_TIME_ERROR) {}
                else break;
            }
        }
        if (timeLastPrint + std::chrono::seconds(5) < now)
        {
            timeLastPrint = now;
            const auto timePassed = std::chrono::duration_cast<std::chrono::microseconds>(now - startTime);
            const auto sampleRate = double(totalSamples)/timePassed.count();
            printf("\b%g Msps\t%g MBps", sampleRate, sampleRate*numChans*elemSize);
            if (overflows != 0) printf("\tOverflows %u", overflows);
            if (underflows != 0) printf("\tUnderflows %u", underflows);
            printf("\n ");
        }

    }
    device->deactivateStream(stream);
}